

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void free_memory(argon2_context *context,argon2_instance_t *instance)

{
  uint32_t uVar1;
  size_t unaff_RBX;
  void *unaff_R14;
  
  uVar1 = instance->memory_blocks;
  if ((instance->memory != (block *)0x0) && (FLAG_clear_internal_memory != 0)) {
    secure_wipe_memory(unaff_R14,unaff_RBX);
  }
  if (instance->keep_memory != 0) {
    return;
  }
  if (context->free_cbk != (deallocate_fptr)0x0) {
    (*context->free_cbk)((uint8_t *)instance->memory,(size_t)(uVar1 << 10));
    return;
  }
  free(instance->memory);
  return;
}

Assistant:

void free_memory(const argon2_context *context,
                 const argon2_instance_t *instance) {
    size_t memory_size = instance->memory_blocks * ARGON2_BLOCK_SIZE;

    clear_internal_memory(instance->memory, memory_size);

    if (instance->keep_memory) {
        /* user-supplied memory -- do not free */
        return;
    }

    if (context->free_cbk) {
        (context->free_cbk)((uint8_t *)instance->memory, memory_size);
    } else {
        free(instance->memory);
    }
}